

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

void __thiscall
gl4cts::GLSL420Pack::Utils::program::compile(program *this,GLuint shader_id,shaderSource *source)

{
  pointer *this_00;
  GLint GVar1;
  code *pcVar2;
  undefined4 uVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  size_type sVar8;
  value_type pcVar9;
  reference ppcVar10;
  ulong uVar11;
  const_reference pvVar12;
  reference pvVar13;
  reference pvVar14;
  shaderCompilationException *this_01;
  undefined1 local_98 [8];
  vector<char,_std::allocator<char>_> message;
  GLint length;
  GLuint i_1;
  GLuint i;
  reference local_68;
  GLint *lengths;
  vector<int,_std::allocator<int>_> lengths_vector;
  vector<const_char_*,_std::allocator<const_char_*>_> parts;
  GLint status;
  Functions *gl;
  shaderSource *source_local;
  GLuint shader_id_local;
  program *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext(this->m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  parts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  this_00 = &lengths_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&lengths);
  local_68 = (reference)0x0;
  sVar8 = std::
          vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
          ::size(&source->m_parts);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::resize
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)this_00,sVar8);
  length = 0;
  while( true ) {
    sVar8 = std::
            vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
            ::size(&source->m_parts);
    if (sVar8 <= (uint)length) break;
    std::
    vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
    ::operator[](&source->m_parts,(ulong)(uint)length);
    pcVar9 = (value_type)std::__cxx11::string::c_str();
    ppcVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                         ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                          &lengths_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage,(ulong)(uint)length);
    *ppcVar10 = pcVar9;
    length = length + 1;
  }
  if ((source->m_use_lengths & 1U) == 1) {
    sVar8 = std::
            vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
            ::size(&source->m_parts);
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&lengths,sVar8);
    message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ = 0;
    while( true ) {
      uVar11 = (ulong)(uint)message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_;
      sVar8 = std::
              vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
              ::size(&source->m_parts);
      if (sVar8 <= uVar11) break;
      pvVar12 = std::
                vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                ::operator[](&source->m_parts,
                             (ulong)(uint)message.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl._20_4_);
      GVar1 = pvVar12->m_length;
      pvVar13 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&lengths,
                           (ulong)(uint)message.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl._20_4_);
      *pvVar13 = GVar1;
      message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ =
           message.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_ + 1;
    }
    local_68 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&lengths,0);
  }
  pcVar2 = *(code **)(lVar7 + 0x12b8);
  sVar8 = std::
          vector<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
          ::size(&source->m_parts);
  ppcVar10 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                       ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                        &lengths_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
  (*pcVar2)(shader_id,sVar8 & 0xffffffff,ppcVar10,local_68);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"ShaderSource",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x465a);
  (**(code **)(lVar7 + 0x248))(shader_id);
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"CompileShader",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x465e);
  (**(code **)(lVar7 + 0xa70))
            (shader_id,0x8b81,
             (undefined1 *)
             ((long)&parts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  dVar5 = (**(code **)(lVar7 + 0x800))();
  glu::checkError(dVar5,"GetShaderiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                  ,0x4662);
  if (parts.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ != 1) {
    message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_ = 0;
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_98);
    (**(code **)(lVar7 + 0xa70))
              (shader_id,0x8b84,
               &message.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"GetShaderiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x466c);
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)local_98,
               (long)(int)message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_);
    uVar3 = message.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_4_;
    pcVar2 = *(code **)(lVar7 + 0xa58);
    pvVar14 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_98,0);
    (*pcVar2)(shader_id,uVar3,0,pvVar14);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"GetShaderInfoLog",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
                    ,0x4673);
    this_01 = (shaderCompilationException *)__cxa_allocate_exception(0x48);
    pvVar14 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_98,0);
    shaderCompilationException::shaderCompilationException(this_01,source,pvVar14);
    __cxa_throw(this_01,&shaderCompilationException::typeinfo,
                shaderCompilationException::~shaderCompilationException);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&lengths);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)
             &lengths_vector.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void Utils::program::compile(glw::GLuint shader_id, const Utils::shaderSource& source) const
{
	/* GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Compilation status */
	glw::GLint status = GL_FALSE;

	/* Source parts and lengths vectors */
	std::vector<const GLchar*> parts;
	std::vector<GLint>		   lengths_vector;
	GLint*					   lengths = 0;

	/* Prepare storage */
	parts.resize(source.m_parts.size());

	/* Prepare arrays */
	for (GLuint i = 0; i < source.m_parts.size(); ++i)
	{
		parts[i] = source.m_parts[i].m_code.c_str();
	}

	if (true == source.m_use_lengths)
	{
		lengths_vector.resize(source.m_parts.size());

		for (GLuint i = 0; i < source.m_parts.size(); ++i)
		{
			lengths_vector[i] = source.m_parts[i].m_length;
		}

		lengths = &lengths_vector[0];
	}

	/* Set source code */
	gl.shaderSource(shader_id, static_cast<GLsizei>(source.m_parts.size()), &parts[0], lengths);
	GLU_EXPECT_NO_ERROR(gl.getError(), "ShaderSource");

	/* Compile */
	gl.compileShader(shader_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "CompileShader");

	/* Get compilation status */
	gl.getShaderiv(shader_id, GL_COMPILE_STATUS, &status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

	/* Log compilation error */
	if (GL_TRUE != status)
	{
		glw::GLint				 length = 0;
		std::vector<glw::GLchar> message;

		/* Error log length */
		gl.getShaderiv(shader_id, GL_INFO_LOG_LENGTH, &length);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderiv");

		/* Prepare storage */
		message.resize(length);

		/* Get error log */
		gl.getShaderInfoLog(shader_id, length, 0, &message[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "GetShaderInfoLog");

		throw shaderCompilationException(source, &message[0]);
	}
}